

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QControlledGate2<float>::apply
          (QControlledGate2<float> *this,Side side,Op op,int nbQubits,SquareMatrix<float> *matrix,
          int offset)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int iVar6;
  int iVar7;
  int64_t iVar8;
  reference pvVar9;
  undefined4 extraout_var;
  long lVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  byte bVar14;
  float x2_3;
  float x1_3;
  int64_t i2_1;
  int64_t i1_1;
  int64_t i_3;
  int64_t k_3;
  int64_t j_3;
  float x2_2;
  float x1_2;
  int64_t j2_1;
  int64_t j1_1;
  int64_t j_2;
  int64_t k_2;
  int64_t i_2;
  int64_t nRight_1;
  int64_t nLeft_1;
  int64_t d_1;
  float x2_1;
  float x1_1;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  float x2;
  float x1;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  int64_t d;
  undefined1 local_50 [8];
  matrix_type mat1;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  SquareMatrix<float> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QControlledGate2<float> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2e,
                  "virtual void qclab::qgates::QControlledGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  iVar8 = dense::SquareMatrix<float>::size(matrix);
  bVar14 = (byte)nbQubits;
  if (iVar8 != 1 << (bVar14 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x2f,
                  "virtual void qclab::qgates::QControlledGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[5])(&mat1.data_);
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,0);
  *pvVar9 = offset + *pvVar9;
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,1);
  *pvVar9 = offset + *pvVar9;
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,0);
  if (nbQubits <= *pvVar9) {
    __assert_fail("qubits[0] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x33,
                  "virtual void qclab::qgates::QControlledGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat1.data_,1);
  if (nbQubits <= *pvVar9) {
    __assert_fail("qubits[1] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                  ,0x33,
                  "virtual void qclab::qgates::QControlledGate2<float>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = float]"
                 );
  }
  iVar6 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0x10])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar6) + 0x38))(local_50);
  dense::operateInPlace<qclab::dense::SquareMatrix<float>>(op,(SquareMatrix<float> *)local_50);
  iVar6 = control(this);
  iVar7 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
  if (iVar6 < iVar7) {
    iVar6 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    iVar7 = control(this);
    lVar10 = (long)(1 << ((char)iVar6 - (char)iVar7 & 0x1fU));
    iVar6 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    lVar11 = (long)(1 << ((byte)iVar6 & 0x1f));
    iVar6 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    lVar12 = (long)(1 << ((bVar14 - (char)iVar6) - 1 & 0x1f));
    if (side == Left) {
      for (k = 0; iVar8 = dense::SquareMatrix<float>::rows(matrix), k < iVar8; k = k + 1) {
        for (j = 0; j < lVar11; j = j + 1) {
          if (((this->controlState_ != 0) || (j % lVar10 < lVar10 / 2)) &&
             ((this->controlState_ != 1 || (lVar10 / 2 <= j % lVar10)))) {
            for (j1 = 0; j1 < lVar12; j1 = j1 + 1) {
              lVar1 = j1 + j * lVar12 * 2;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,k,lVar1);
              fVar2 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,k,lVar1 + lVar12);
              fVar3 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,0);
              fVar4 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,0);
              fVar5 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,k,lVar1);
              *pfVar13 = fVar4 * fVar2 + fVar5 * fVar3;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,1);
              fVar4 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,1);
              fVar5 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,k,lVar1 + lVar12);
              *pfVar13 = fVar4 * fVar2 + fVar5 * fVar3;
            }
          }
        }
      }
    }
    else {
      for (k_1 = 0; iVar8 = dense::SquareMatrix<float>::cols(matrix), k_1 < iVar8; k_1 = k_1 + 1) {
        for (i_1 = 0; i_1 < lVar11; i_1 = i_1 + 1) {
          if (((this->controlState_ != 0) || (i_1 % lVar10 < lVar10 / 2)) &&
             ((this->controlState_ != 1 || (lVar10 / 2 <= i_1 % lVar10)))) {
            for (i1 = 0; i1 < lVar12; i1 = i1 + 1) {
              lVar1 = i1 + i_1 * lVar12 * 2;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,lVar1,k_1);
              fVar2 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,lVar1 + lVar12,k_1);
              fVar3 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,0);
              fVar4 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,1);
              fVar5 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,lVar1,k_1);
              *pfVar13 = fVar4 * fVar2 + fVar5 * fVar3;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,0);
              fVar4 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,1);
              fVar5 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,lVar1 + lVar12,k_1);
              *pfVar13 = fVar4 * fVar2 + fVar5 * fVar3;
            }
          }
        }
      }
    }
  }
  else {
    iVar6 = control(this);
    lVar10 = (long)(1 << (bVar14 - (char)iVar6 & 0x1f));
    iVar6 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    lVar11 = (long)(1 << ((byte)iVar6 & 0x1f));
    iVar6 = (*(this->super_QGate2<float>).super_QObject<float>._vptr_QObject[0xf])();
    lVar12 = (long)(1 << ((bVar14 - (char)iVar6) - 1 & 0x1f));
    if (side == Left) {
      for (k_2 = 0; iVar8 = dense::SquareMatrix<float>::cols(matrix), k_2 < iVar8; k_2 = k_2 + 1) {
        for (j_2 = 0; j_2 < lVar11; j_2 = j_2 + 1) {
          for (j1_1 = 0; j1_1 < lVar12; j1_1 = j1_1 + 1) {
            if (((this->controlState_ != 0) || (j1_1 % lVar10 < lVar10 / 2)) &&
               ((this->controlState_ != 1 || (lVar10 / 2 <= j1_1 % lVar10)))) {
              lVar1 = j1_1 + j_2 * lVar12 * 2;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,k_2,lVar1);
              fVar2 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,k_2,lVar1 + lVar12);
              fVar3 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,0);
              fVar4 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,0);
              fVar5 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,k_2,lVar1);
              *pfVar13 = fVar4 * fVar2 + fVar5 * fVar3;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,1);
              fVar4 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,1);
              fVar5 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,k_2,lVar1 + lVar12);
              *pfVar13 = fVar4 * fVar2 + fVar5 * fVar3;
            }
          }
        }
      }
    }
    else {
      for (k_3 = 0; iVar8 = dense::SquareMatrix<float>::cols(matrix), k_3 < iVar8; k_3 = k_3 + 1) {
        for (i_3 = 0; i_3 < lVar11; i_3 = i_3 + 1) {
          for (i1_1 = 0; i1_1 < lVar12; i1_1 = i1_1 + 1) {
            if (((this->controlState_ != 0) || (i1_1 % lVar10 < lVar10 / 2)) &&
               ((this->controlState_ != 1 || (lVar10 / 2 <= i1_1 % lVar10)))) {
              lVar1 = i1_1 + i_3 * lVar12 * 2;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,lVar1,k_3);
              fVar2 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,lVar1 + lVar12,k_3);
              fVar3 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,0);
              fVar4 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,0,1);
              fVar5 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,lVar1,k_3);
              *pfVar13 = fVar4 * fVar2 + fVar5 * fVar3;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,0);
              fVar4 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()((SquareMatrix<float> *)local_50,1,1);
              fVar5 = *pfVar13;
              pfVar13 = dense::SquareMatrix<float>::operator()(matrix,lVar1 + lVar12,k_3);
              *pfVar13 = fVar4 * fVar2 + fVar5 * fVar3;
            }
          }
        }
      }
    }
  }
  dense::SquareMatrix<float>::~SquareMatrix((SquareMatrix<float> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&mat1.data_);
  return;
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }